

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool util::PrintRecords(SelectStatement *stmt,
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                       *cols,table *t,int *selectvalue)

{
  string *__lhs;
  ExprType EVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  *ppVar2;
  undefined8 uVar3;
  pointer ppcVar4;
  column *pcVar5;
  pointer ppVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  __type _Var10;
  bool bVar11;
  int iVar12;
  ostream *poVar13;
  int *piVar14;
  Expr *pEVar15;
  char *pcVar16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  char *pcVar18;
  ExprType EVar19;
  long lVar20;
  int iVar21;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  *ppVar22;
  column *pcVar23;
  int iVar24;
  pointer ppVar25;
  pointer ppcVar26;
  int local_2b4;
  SelectStatement *local_2b0;
  table *local_2a8;
  int local_29c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*> it
  ;
  vector<int,_std::allocator<int>_> printedrecords;
  ifstream os;
  
  local_2b0 = stmt;
  local_2a8 = t;
  std::__cxx11::string::string((string *)&it,(string *)&t->filename);
  std::ifstream::ifstream(&os,(string *)&it,_S_in|_S_bin);
  std::__cxx11::string::~string((string *)&it);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    poVar13 = std::operator<<((ostream *)&std::cout,"Can\'t open table ");
    poVar13 = std::operator<<(poVar13,local_2b0->fromTable->name);
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  else {
    ppVar22 = (cols->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (cols->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar22 != ppVar2) {
      for (; ppVar22 != ppVar2; ppVar22 = ppVar22 + 1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
        ::pair(&it,ppVar22);
        pcVar23 = it.second;
        if (it.second == (column *)0x0) {
LAB_00117494:
          lVar7 = std::cout;
          *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
          lVar20 = 8;
LAB_001174b7:
          *(long *)(std::__cxx11::string::string + *(long *)(lVar7 + -0x18)) = lVar20;
          poVar13 = std::operator<<(&std::cout,0x20);
          std::operator<<(poVar13,(string *)&it);
        }
        else {
          __lhs = &(it.second)->flag;
          bVar9 = std::operator==(__lhs,"INT");
          if (bVar9) goto LAB_00117494;
          bVar9 = std::operator==(__lhs,"CHAR");
          lVar7 = std::cout;
          if (bVar9) {
            *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
            iVar21 = pcVar23->element_size + 2;
            if (pcVar23->element_size < 7) {
              iVar21 = 8;
            }
            lVar20 = (long)iVar21;
            goto LAB_001174b7;
          }
        }
        std::__cxx11::string::~string((string *)&it);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_2b4 = 0;
      while( true ) {
        bVar9 = local_2a8->rowlength <= local_2b4;
        if (local_2a8->rowlength <= local_2b4) break;
        pEVar15 = local_2b0->whereClause;
        if (pEVar15 != (Expr *)0x0) {
          if (((pEVar15->type == kExprOperator) && (pEVar15->opType == SIMPLE_OP)) &&
             ((byte)(pEVar15->opChar - 0x3cU) < 3)) {
            if ((pEVar15->expr2->type != kExprLiteralInt) &&
               (EVar19 = pEVar15->expr->type, EVar19 != kExprLiteralInt)) {
LAB_0011779c:
              EVar1 = pEVar15->expr2->type;
              if ((EVar19 != kExprColumnRef) || (EVar1 != kExprColumnRef)) {
                if ((EVar19 != kExprLiteralString) && (EVar1 != kExprLiteralString))
                goto LAB_0011790f;
                it.first._M_dataplus._M_p = (pointer)&it.first.field_2;
                it.first._M_string_length = 0;
                it.first.field_2._M_local_buf[0] = '\0';
                if (pEVar15->expr2->type == kExprLiteralString) {
                  std::__cxx11::string::assign((char *)&it);
                  lVar20 = 0x10;
                }
                else {
                  std::__cxx11::string::assign((char *)&it);
                  lVar20 = 8;
                }
                pcVar18 = *(char **)(*(long *)((long)&local_2b0->whereClause->type + lVar20) + 0x28)
                ;
                ppcVar4 = (local_2a8->table_cols).
                          super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                pcVar23 = (column *)0x0;
                for (ppcVar26 = (local_2a8->table_cols).
                                super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                                super__Vector_impl_data._M_start; ppcVar26 != ppcVar4;
                    ppcVar26 = ppcVar26 + 1) {
                  pcVar5 = *ppcVar26;
                  _Var10 = std::operator==(&it.first,&pcVar5->name);
                  if (_Var10) {
                    pcVar23 = pcVar5;
                  }
                }
                if (pcVar23 == (column *)0x0) {
                  poVar13 = std::operator<<((ostream *)&std::cout,"column ");
                  poVar13 = std::operator<<(poVar13,(string *)&it);
                  poVar13 = std::operator<<(poVar13," do not exist in table");
                  std::endl<char,std::char_traits<char>>(poVar13);
                  goto LAB_00117cfc;
                }
                std::istream::seekg(&os,(long)pcVar23->col_offset +
                                        (long)local_2a8->rowSize * (long)local_2b4,0);
                iVar21 = pcVar23->element_truesize;
                if (iVar21 < 0) {
                  iVar21 = -1;
                }
                pcVar16 = (char *)operator_new__((long)iVar21);
                std::istream::read((char *)&os,(long)pcVar16);
                cVar8 = local_2b0->whereClause->opChar;
                if (cVar8 == '<') {
                  iVar21 = compareChar(pcVar16,pcVar18);
                  if (iVar21 != -1) goto LAB_00117c23;
                }
                else if (cVar8 == '>') {
                  iVar21 = compareChar(pcVar16,pcVar18);
                  if (iVar21 != 1) goto LAB_00117c23;
                }
                else if ((cVar8 == '=') && (bVar9 = compareString(pcVar16,pcVar18), !bVar9)) {
LAB_00117c23:
                  operator_delete(pcVar16);
                  goto LAB_001177f9;
                }
                std::__cxx11::string::~string((string *)&it);
                goto LAB_0011790f;
              }
              goto LAB_00117c02;
            }
            it.first._M_dataplus._M_p = (pointer)&it.first.field_2;
            it.first._M_string_length = 0;
            it.first.field_2._M_local_buf[0] = '\0';
            EVar19 = pEVar15->expr2->type;
            if (EVar19 == kExprLiteralInt) {
              if (pEVar15->expr->type != kExprLiteralString) {
                std::__cxx11::string::assign((char *)&it);
                lVar20 = 0x10;
                goto LAB_00117648;
              }
LAB_00117c67:
              poVar13 = std::operator<<((ostream *)&std::cout,
                                        "cannot do compare between int and char");
              std::endl<char,std::char_traits<char>>(poVar13);
            }
            else {
              if (EVar19 == kExprLiteralString) goto LAB_00117c67;
              std::__cxx11::string::assign((char *)&it);
              lVar20 = 8;
LAB_00117648:
              uVar3 = *(undefined8 *)
                       (*(long *)((long)&local_2b0->whereClause->type + lVar20) + 0x48);
              ppcVar4 = (local_2a8->table_cols).
                        super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              pcVar23 = (column *)0x0;
              for (ppcVar26 = (local_2a8->table_cols).
                              super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                              super__Vector_impl_data._M_start; ppcVar26 != ppcVar4;
                  ppcVar26 = ppcVar26 + 1) {
                pcVar5 = *ppcVar26;
                _Var10 = std::operator==(&it.first,&pcVar5->name);
                if (_Var10) {
                  pcVar23 = pcVar5;
                }
              }
              if (pcVar23 == (column *)0x0) {
                poVar13 = std::operator<<((ostream *)&std::cout,"column ");
                poVar13 = std::operator<<(poVar13,(string *)&it);
                poVar13 = std::operator<<(poVar13," do not exist in table");
                std::endl<char,std::char_traits<char>>(poVar13);
              }
              else {
                std::istream::seekg(&os,(long)pcVar23->col_offset +
                                        (long)local_2a8->rowSize * (long)local_2b4,0);
                iVar21 = pcVar23->element_truesize;
                if (iVar21 < 0) {
                  iVar21 = -1;
                }
                piVar14 = (int *)operator_new__((long)iVar21);
                std::istream::read((char *)&os,(long)piVar14);
                cVar8 = local_2b0->whereClause->opChar;
                iVar21 = (int)uVar3;
                if (cVar8 != '=') {
LAB_00117729:
                  if (cVar8 == '>') {
                    bVar11 = std::operator==(&pcVar23->flag,"CHAR");
                    if (bVar11) {
                      pcVar18 = "cannot do > for char columns with int value";
                      goto LAB_00117cdb;
                    }
                    if (*piVar14 <= iVar21) goto LAB_001177f1;
                    cVar8 = local_2b0->whereClause->opChar;
                  }
                  if (cVar8 == '<') {
                    bVar11 = std::operator==(&pcVar23->flag,"CHAR");
                    if (bVar11) {
                      pcVar18 = "cannot do < for char columns with int value";
                      goto LAB_00117cdb;
                    }
                    if (iVar21 <= *piVar14) goto LAB_001177f1;
                  }
                  std::__cxx11::string::~string((string *)&it);
                  pEVar15 = local_2b0->whereClause;
                  EVar19 = pEVar15->expr->type;
                  goto LAB_0011779c;
                }
                bVar11 = std::operator==(&pcVar23->flag,"CHAR");
                if (!bVar11) {
                  if (*piVar14 == iVar21) {
                    cVar8 = local_2b0->whereClause->opChar;
                    goto LAB_00117729;
                  }
LAB_001177f1:
                  operator_delete(piVar14);
LAB_001177f9:
                  std::__cxx11::string::~string((string *)&it);
                  goto LAB_00117c02;
                }
                pcVar18 = "cannot do = for char columns with int value";
LAB_00117cdb:
                poVar13 = std::operator<<((ostream *)&std::cout,pcVar18);
                std::endl<char,std::char_traits<char>>(poVar13);
                operator_delete(piVar14);
              }
            }
LAB_00117cfc:
            std::__cxx11::string::~string((string *)&it);
          }
          else {
            poVar13 = std::operator<<((ostream *)&std::cout,"Invalide where clause");
            std::endl<char,std::char_traits<char>>(poVar13);
          }
          goto LAB_00117d06;
        }
LAB_0011790f:
        bVar9 = false;
        for (local_29c = 0; local_29c < local_2b4; local_29c = local_29c + 1) {
          _Var17 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,&local_29c);
          if (_Var17._M_current !=
              printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            ppVar6 = (cols->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            iVar21 = 0;
            iVar24 = 0;
            for (ppVar25 = (cols->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar6;
                ppVar25 = ppVar25 + 1) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
              ::pair(&it,ppVar25);
              pcVar23 = it.second;
              if (it.second != (column *)0x0) {
                std::istream::seekg(&os,(long)(it.second)->col_offset +
                                        (long)local_2a8->rowSize * (long)local_29c,0);
                iVar12 = pcVar23->element_truesize;
                if (iVar12 < 0) {
                  iVar12 = -1;
                }
                pcVar18 = (char *)operator_new__((long)iVar12);
                std::istream::read((char *)&os,(long)pcVar18);
                std::istream::seekg(&os,(long)pcVar23->col_offset +
                                        (long)local_2a8->rowSize * (long)local_2b4,0);
                iVar12 = pcVar23->element_truesize;
                if (iVar12 < 0) {
                  iVar12 = -1;
                }
                pcVar16 = (char *)operator_new__((long)iVar12);
                std::istream::read((char *)&os,(long)pcVar16);
                bVar11 = compareString(pcVar18,pcVar16);
                iVar24 = iVar24 + (uint)bVar11;
                iVar21 = iVar21 + 1;
                operator_delete(pcVar18);
                operator_delete(pcVar16);
              }
              std::__cxx11::string::~string((string *)&it);
            }
            bVar9 = (bool)(bVar9 | iVar24 == iVar21);
          }
        }
        if (!bVar9) {
          ppVar6 = (cols->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar25 = (cols->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar6;
              ppVar25 = ppVar25 + 1) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
            ::pair(&it,ppVar25);
            pcVar23 = it.second;
            std::vector<int,_std::allocator<int>_>::push_back(&printedrecords,&local_2b4);
            lVar20 = std::cout;
            if (pcVar23 == (column *)0x0) {
              *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20
              ;
              *(undefined8 *)(std::__cxx11::string::string + *(long *)(lVar20 + -0x18)) = 8;
              poVar13 = std::operator<<(&std::cout,0x20);
              std::operator<<(poVar13,(string *)&it);
            }
            else {
              std::istream::seekg(&os,(long)pcVar23->col_offset +
                                      (long)local_2a8->rowSize * (long)local_2b4,0);
              iVar21 = pcVar23->element_truesize;
              if (iVar21 < 0) {
                iVar21 = -1;
              }
              piVar14 = (int *)operator_new__((long)iVar21);
              std::istream::read((char *)&os,(long)piVar14);
              bVar9 = std::operator==(&pcVar23->flag,"INT");
              lVar20 = std::cout;
              *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20
              ;
              if (bVar9) {
                *(undefined8 *)(std::__cxx11::string::string + *(long *)(lVar20 + -0x18)) = 8;
                poVar13 = std::operator<<(&std::cout,0x20);
                std::ostream::operator<<(poVar13,*piVar14);
                *selectvalue = *piVar14;
              }
              else {
                iVar21 = pcVar23->element_size + 2;
                if (pcVar23->element_size < 7) {
                  iVar21 = 8;
                }
                *(long *)(std::__cxx11::string::string + *(long *)(lVar20 + -0x18)) = (long)iVar21;
                poVar13 = std::operator<<(&std::cout,0x20);
                std::operator<<(poVar13,(char *)piVar14);
              }
              operator_delete(piVar14);
            }
            std::__cxx11::string::~string((string *)&it);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
LAB_00117c02:
        local_2b4 = local_2b4 + 1;
      }
      std::ifstream::close();
LAB_00117d06:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&printedrecords.super__Vector_base<int,_std::allocator<int>_>);
      goto LAB_00117d10;
    }
  }
  bVar9 = false;
LAB_00117d10:
  std::ifstream::~ifstream(&os);
  return bVar9;
}

Assistant:

bool util::PrintRecords(hsql::SelectStatement *stmt, vector<pair<string, column*>> cols, table* t, int &selectvalue){
    ifstream os(t->getName(), ios::in|ios::binary);

    if(!os.is_open()){
        cout <<"Can't open table "<< stmt->fromTable->name  <<endl;
        return false;
    }
    if(cols.empty()){
        return false;
    }
    // header
    for(auto it : cols){
        column* col = it.second;
        if(col == NULL || col->flag == "INT")
            cout <<left<<setw(8)<<setfill(' ')<<it.first;
        else if(col->flag == "CHAR")
            cout <<left<<setw(col->element_size +2 > 8 ? col->element_size+2 : 8)<<setfill(' ')<<it.first;
    }
    cout << endl;

    vector<int> printedrecords;
    //print records
    for(int i = 0; i < t->getRowlength(); i++){

        //where condition
        if(stmt->whereClause != NULL){
            if(stmt->whereClause->type != hsql::kExprOperator ||
               stmt->whereClause->opType != hsql::Expr::SIMPLE_OP||
               (stmt->whereClause->opChar != '=' && stmt->whereClause->opChar != '>'&&
                stmt->whereClause->opChar != '<')){
                cout <<"Invalide where clause"<<endl;
                return false;
            }
            //deal with int
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt||stmt->whereClause->expr->type == hsql::kExprLiteralInt){
                //select column
                string colName;
                int compareNum;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt) {
                    if(stmt->whereClause->expr->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr->name;
                    compareNum = (int) stmt->whereClause->expr2->ival;
                }
                else {
                    if(stmt->whereClause->expr2->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr2->name;
                    compareNum = (int) stmt->whereClause->expr->ival;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do = for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if(stmt->whereClause->opChar == '>'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do > for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes <= compareNum){
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if(stmt->whereClause->opChar == '<'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do < for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes >= compareNum){
                        delete bytes;
                        continue;
                    }
                }

            }
            if(stmt->whereClause->expr->type == hsql::kExprColumnRef&&stmt->whereClause->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralString||stmt->whereClause->expr->type == hsql::kExprLiteralString){
                //select column
                string colName;
                char* compareChar;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->whereClause->expr->name;
                    compareChar = stmt->whereClause->expr2->name;
                }
                else {
                    colName = stmt->whereClause->expr2->name;
                    compareChar = stmt->whereClause->expr->name;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if (!util::compareString(bytes ,compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if(stmt->whereClause->opChar == '>'){
                    if(util::compareChar(bytes, compareChar) != 1){
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if(stmt->whereClause->opChar == '<'){
                    if(util::compareChar(bytes, compareChar) != -1){
                        delete bytes;
                        continue;
                    }
                }

            }

        }
        //check duplicates
        bool duplicates = false;
        for(int j = 0; j<i; j++){
            if(find(printedrecords.begin(), printedrecords.end(), j)== printedrecords.end())
                continue;
            int count_duplicates = 0;
            int countcol = 0;
            for(auto it:cols){
                column* col = it.second;
                if (col!=NULL){
                    os.seekg(j * t->getrowSize() + col->col_offset);
                    char* prebytes = new char[col->element_truesize];
                    os.read(prebytes, col->element_truesize);

                    os.seekg(i * t->getrowSize() + col->col_offset);
                    char* curbytes = new char[col->element_truesize];
                    os.read(curbytes, col->element_truesize);
                    if(util::compareString(prebytes, curbytes))
                        count_duplicates += 1;
                    countcol += 1;
                    delete prebytes;
                    delete curbytes;
                }

            }
            if(count_duplicates == countcol)
                duplicates = true;
        }
        if(duplicates)
            continue;
        //do print

        for(auto it:cols) {
            column *col = it.second;
            printedrecords.push_back(i);

            if (col != NULL) {

                os.seekg(i * t->getrowSize() + col->col_offset);
                char *bytes = new char[col->element_truesize];
                //cout << "bytes: " << bytes << " -- true size: " << col->element_truesize << endl;
                os.read(bytes, col->element_truesize);


                if ( col->flag == "INT"){
                    cout << left << setw(8) << setfill(' ') << *(int *) bytes;
                    selectvalue = *(int *) bytes;

                }

                else {
                    cout << left << setw(col->element_size + 2 > 8 ? col->element_size + 2 : 8)
                         << setfill(' ') << bytes;
                }

                delete bytes;

            } else {
                cout << left << setw(8) << setfill(' ') << it.first;
            }
        }
        cout << endl;
    }
    os.close();
    return true;
}